

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image.cpp
# Opt level: O3

integral_image * create_integral_img(int width,int height)

{
  integral_image *piVar1;
  float *pfVar2;
  
  piVar1 = (integral_image *)malloc(0x20);
  piVar1->width = width;
  piVar1->height = height;
  piVar1->data_width = width;
  piVar1->data_height = height;
  pfVar2 = (float *)malloc((long)(height * width) << 2);
  piVar1->padded_data = pfVar2;
  piVar1->data = pfVar2;
  return piVar1;
}

Assistant:

struct integral_image *create_integral_img(int width, int height) {
    
    // Allocating memory to integral image that is returned
    struct integral_image *iimage = (struct integral_image *)malloc(sizeof(struct integral_image));
    
    // Setting real image width and height
    iimage->width = width;
    iimage->height = height;
    
    // Setting data width and height to be same as normal width and height
    // since this integral image has no padding
    iimage->data_width = width;
    iimage->data_height = height;

    // Allocating data for storing values of integral image
    iimage->padded_data = (float *)malloc(width * height * sizeof(float));
    
    // Setting data and padded data to be equal since this integral image has no padding
    iimage->data = iimage->padded_data;

    return iimage;

}